

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

void Gia_Iso2ManCollectOrder_rec
               (Gia_Man_t *p,int Id,Vec_Int_t *vRoots,Vec_Int_t *vVec,Vec_Int_t *vMap)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar2 = Gia_ObjIsTravIdCurrentId(p,Id);
  if (iVar2 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrentId(p,Id);
  pGVar4 = Gia_ManObj(p,Id);
  uVar1 = *(ulong *)pGVar4;
  uVar3 = (uint)uVar1;
  uVar6 = uVar1 & 0x1fffffff;
  if (uVar6 == 0x1fffffff || (int)uVar3 < 0) {
    if (-1 < (int)uVar3 || (int)uVar6 == 0x1fffffff) {
      if ((~uVar3 & 0x9fffffff) == 0) {
        iVar2 = Gia_ObjIsRo(p,pGVar4);
        if (iVar2 != 0) {
          pGVar4 = Gia_ObjRoToRi(p,pGVar4);
          iVar2 = Gia_ObjId(p,pGVar4);
          Vec_IntPush(vRoots,iVar2);
        }
      }
      else if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
        __assert_fail("Gia_ObjIsConst0(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso2.c"
                      ,0x1ce,
                      "void Gia_Iso2ManCollectOrder_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      goto LAB_00588fe5;
    }
  }
  else {
    uVar5 = (uint)(uVar1 >> 0x20);
    if (pGVar4[-(ulong)(uVar5 & 0x1fffffff)].Value < pGVar4[-uVar6].Value) {
      Gia_Iso2ManCollectOrder_rec(p,Id - (uVar5 & 0x1fffffff),vRoots,vVec,vMap);
      uVar3 = *(uint *)pGVar4;
    }
    else {
      Gia_Iso2ManCollectOrder_rec(p,Id - (uVar3 & 0x1fffffff),vRoots,vVec,vMap);
      uVar3 = *(uint *)&pGVar4->field_0x4;
    }
  }
  Gia_Iso2ManCollectOrder_rec(p,Id - (uVar3 & 0x1fffffff),vRoots,vVec,vMap);
LAB_00588fe5:
  Vec_IntWriteEntry(vMap,Id,vVec->nSize);
  Vec_IntPush(vVec,Id);
  return;
}

Assistant:

void Gia_Iso2ManCollectOrder_rec( Gia_Man_t * p, int Id, Vec_Int_t * vRoots, Vec_Int_t * vVec, Vec_Int_t * vMap )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ObjFanin0(pObj)->Value <= Gia_ObjFanin1(pObj)->Value )
        {
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vVec, vMap );
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId1(pObj, Id), vRoots, vVec, vMap );
        }
        else
        {
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId1(pObj, Id), vRoots, vVec, vMap );
            Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vVec, vMap );
        }
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_Iso2ManCollectOrder_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vVec, vMap );
    }
    else if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
    }
    else assert( Gia_ObjIsConst0(pObj) );
    Vec_IntWriteEntry( vMap, Id, Vec_IntSize(vVec) );
    Vec_IntPush( vVec, Id );
}